

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitR(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  PtexSeparableKernel *in_RDI;
  int w;
  uint in_stack_ffffffffffffffcc;
  Res in_stack_ffffffffffffffd6;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe8;
  
  iVar1 = in_RDI->u + in_RDI->uw;
  iVar2 = Res::u(&in_RDI->res);
  iVar2 = iVar1 - iVar2;
  if (iVar2 < in_RDI->uw) {
    set((PtexSeparableKernel *)((ulong)in_stack_ffffffffffffffcc << 0x20),in_stack_ffffffffffffffd6,
        (int)((ulong)in_RDI->kv >> 0x20),(int)in_RDI->kv,
        (int)((ulong)(in_RDI->ku + ((long)in_RDI->uw - (long)iVar2)) >> 0x20),
        (int)(in_RDI->ku + ((long)in_RDI->uw - (long)iVar2)),
        (float *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
        (float *)CONCAT44(iVar2,CONCAT22(in_RDI->res,in_stack_ffffffffffffffe8)),(int)in_RSI);
    in_RDI->uw = in_RDI->uw - iVar2;
  }
  else {
    operator=((PtexSeparableKernel *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_RDI);
    iVar1 = Res::u(&in_RDI->res);
    *(int *)(in_RSI + 4) = *(int *)(in_RSI + 4) - iVar1;
    in_RDI->u = 0;
    in_RDI->uw = 0;
  }
  return;
}

Assistant:

void splitR(PtexSeparableKernel& k)
    {
        // split off right piece of width w into k
        int w = u + uw - res.u();

        if (w < uw) {
            // normal case - split off a portion
            //    res  u  v  uw vw  ku           kv
            k.set(res, 0, v, w, vw, ku + uw - w, kv);

            // update local
            uw -= w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.u -= res.u();
            u = 0; uw = 0;
        }
    }